

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  uint8_t uVar1;
  int iVar2;
  Inst *pIVar3;
  Frag FVar4;
  ulong uVar5;
  ulong uVar6;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  uint uStack_194;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  pIVar3 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
  if ((pIVar3[root].out_opcode_ & 7) == 2) {
    if (((pIVar3[root].field_1.byte_range.lo_ == pIVar3[id].field_1.byte_range.lo_) &&
        (pIVar3[root].field_1.byte_range.hi_ == pIVar3[id].field_1.byte_range.hi_)) &&
       (((pIVar3[id].field_1.byte_range.hint_foldcase_ ^
         pIVar3[root].field_1.byte_range.hint_foldcase_) & 1) == 0)) {
      iStack_19c = 0;
      iStack_198 = 0;
      local_1a0 = root;
      goto LAB_0182b7ec;
    }
  }
  else {
    uVar6 = (ulong)(uint)root;
    do {
      uVar5 = uVar6;
      local_1a0 = (int)uVar5;
      if ((pIVar3[local_1a0].out_opcode_ & 7) != 0) {
        std::__cxx11::ostringstream::ostringstream(aoStack_188);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_188,"should never happen",0x13);
        std::__cxx11::ostringstream::~ostringstream(aoStack_188);
        std::ios_base::~ios_base(local_118);
        goto LAB_0182b7db;
      }
      iVar2 = pIVar3[local_1a0].field_1.cap_;
      uVar1 = pIVar3[id].field_1.byte_range.lo_;
      if (((pIVar3[iVar2].field_1.byte_range.lo_ == uVar1) &&
          (pIVar3[iVar2].field_1.byte_range.hi_ == pIVar3[id].field_1.byte_range.hi_)) &&
         (((pIVar3[id].field_1.byte_range.hint_foldcase_ ^
           pIVar3[iVar2].field_1.byte_range.hint_foldcase_) & 1) == 0)) {
        iStack_19c = local_1a0 * 2 + 1;
        iStack_198 = iStack_19c;
        goto LAB_0182b7ec;
      }
      if ((this->reversed_ & 1U) == 0) goto LAB_0182b7db;
      uVar6 = (ulong)(pIVar3[local_1a0].out_opcode_ >> 4);
    } while ((pIVar3[uVar6].out_opcode_ & 7) == 0);
    if (((pIVar3[uVar6].field_1.byte_range.lo_ == uVar1) &&
        (pIVar3[uVar6].field_1.byte_range.hi_ == pIVar3[id].field_1.byte_range.hi_)) &&
       (((pIVar3[id].field_1.byte_range.hint_foldcase_ ^
         pIVar3[uVar6].field_1.byte_range.hint_foldcase_) & 1) == 0)) {
      iStack_19c = local_1a0 * 2;
      iStack_198 = (int)((uVar5 << 0x21) >> 0x20);
      goto LAB_0182b7ec;
    }
  }
LAB_0182b7db:
  local_1a0 = 0;
  iStack_19c = 0;
  iStack_198 = 0;
LAB_0182b7ec:
  uStack_194 = uStack_194 & 0xffffff00;
  FVar4.end.head = iStack_19c;
  FVar4.begin = local_1a0;
  FVar4.end.tail = iStack_198;
  FVar4._12_4_ = uStack_194;
  return FVar4;
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, kNullPatchList, false);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1), false);

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1), false);
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}